

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O3

ztast_expr_t * ztast_expr_from_intarray(ztast_t *ast,ztast_intarray_t *intarr)

{
  ztast_expr_t *pzVar1;
  
  pzVar1 = (ztast_expr_t *)(*ast->mallocfn)(0x10,ast->opaque);
  if (pzVar1 != (ztast_expr_t *)0x0) {
    pzVar1->type = ZTEXPR_INTARRAY;
    (pzVar1->data).value = (ztast_value *)intarr;
  }
  return pzVar1;
}

Assistant:

ztast_expr_t *ztast_expr_from_intarray(ztast_t *ast, ztast_intarray_t *intarr)
{
  ztast_expr_t *expr;

  assert(ast);
  assert(intarr);

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_expr_from_array\n");
#endif

  expr = ZTAST_MALLOC(sizeof(*expr));
  if (expr == NULL)
    return NULL;

  expr->type          = ZTEXPR_INTARRAY;
  expr->data.intarray = intarr;

  return expr;
}